

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppTVar2;
  ostream *poVar3;
  int value;
  ulong uVar4;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  string kIndent;
  string kTestsuites;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"testsuites","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  value = 0;
  for (ppTVar2 = (test_suites->
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 !=
      (test_suites->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
    value = value + (int)((ulong)((long)((*ppTVar2)->test_info_list_).
                                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)((*ppTVar2)->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"tests","");
  OutputJsonKey(stream,&local_70,&local_b0,value,&local_90,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"name","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"AllTests","");
  OutputJsonKey(stream,&local_70,&local_b0,&local_50,&local_90,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": [\n",5);
  if ((test_suites->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish !=
      (test_suites->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      if (uVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
      }
      PrintJsonTestSuite(stream,(test_suites->
                                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(test_suites->
                                   super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(test_suites->
                                   super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";
  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputJsonKey(stream, kTestsuites, "tests", total_tests, kIndent);

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  for (size_t i = 0; i < test_suites.size(); ++i) {
    if (i != 0) {
      *stream << ",\n";
    }
    PrintJsonTestSuite(stream, *test_suites[i]);
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}